

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_make_getter_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type,sexp index)

{
  sexp psVar1;
  
  if ((((ulong)type & 3) == 0) && (type->tag == 1)) {
    type = (sexp)((ulong)(type->value).type.tag * 2 + 1);
  }
  if ((-1 < (long)type & (byte)type) == 0) {
    psVar1 = sexp_type_exception(ctx,self,2,type);
    return psVar1;
  }
  if ((-1 < (long)index & (byte)index) == 0) {
    psVar1 = sexp_type_exception(ctx,self,2,index);
    return psVar1;
  }
  psVar1 = sexp_make_opcode(ctx,self,name,(sexp)&DAT_00000011,(sexp)&DAT_00000063,
                            (sexp)&DAT_00000003,(sexp)&DAT_00000001,type,(sexp)&DAT_00000001,
                            (sexp)&DAT_00000001,type,index,(sexp_proc1)0x0);
  return psVar1;
}

Assistant:

sexp sexp_make_getter_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type, sexp index) {
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  if ((! sexp_fixnump(type))  || (sexp_unbox_fixnum(type) < 0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, type);
  if ((! sexp_fixnump(index)) || (sexp_unbox_fixnum(index) < 0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, index);
  return
    sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_GETTER),
                     sexp_make_fixnum(SEXP_OP_SLOT_REF), SEXP_ONE, SEXP_ZERO,
                     type, SEXP_ZERO, SEXP_ZERO, type, index, NULL);
}